

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_prepare_mlsag
              (uint8_t *m,uint8_t *sk,size_t nOuts,size_t nBlinded,size_t nCols,size_t nRows,
              uint8_t **pcm_in,uint8_t **pcm_out,uint8_t **blinds)

{
  uint8_t *puVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  int overflow;
  secp256k1_scalar accos;
  size_t s;
  secp256k1_gej accj;
  secp256k1_scalar ts;
  secp256k1_scalar accis;
  secp256k1_ge cno;
  secp256k1_ge c;
  int local_214;
  long local_210;
  size_t local_208;
  long local_200;
  uint8_t *local_1f8;
  size_t local_1f0;
  uint8_t **local_1e8;
  uint8_t *local_1e0;
  secp256k1_scalar local_1d8;
  size_t local_1b0;
  secp256k1_gej local_1a8;
  secp256k1_scalar local_128;
  secp256k1_scalar local_108;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  iVar4 = 1;
  if ((((nOuts != 0) && (nCols != 0)) && (m != (uint8_t *)0x0)) && (1 < nRows)) {
    local_1a8.infinity = 1;
    local_1a8.x.n[0] = 0;
    local_1a8.x.n[1] = 0;
    local_1a8.x.n[2] = 0;
    local_1a8.x.n[3] = 0;
    local_1a8.x.n[4] = 0;
    local_1a8.y.n[0] = 0;
    local_1a8.y.n[1] = 0;
    local_1a8.y.n[2] = 0;
    local_1a8.y.n[3] = 0;
    local_1a8.y.n[4] = 0;
    local_1a8.z.n[0] = 0;
    local_1a8.z.n[1] = 0;
    local_1a8.z.n[2] = 0;
    local_1a8.z.n[3] = 0;
    local_1a8.z.n[4] = 0;
    sVar6 = 0;
    sVar7 = nOuts;
    local_208 = nCols;
    local_1f8 = sk;
    local_1f0 = nBlinded;
    local_1e0 = m;
    do {
      iVar4 = load_ge(&local_88,pcm_out[sVar6],sVar7);
      if (iVar4 == 0) {
        return 2;
      }
      secp256k1_gej_add_ge_var(&local_1a8,&local_1a8,&local_88,(secp256k1_fe *)0x0);
      sVar6 = sVar6 + 1;
      sVar7 = extraout_RDX;
    } while (nOuts != sVar6);
    secp256k1_gej_neg(&local_1a8,&local_1a8);
    secp256k1_ge_set_gej(&local_e0,&local_1a8);
    sVar7 = local_208;
    local_200 = (nRows - 1) * local_208;
    sVar5 = 0;
    sVar6 = extraout_RDX_00;
    local_210 = nRows - 1;
    do {
      local_1a8.infinity = 1;
      local_1a8.x.n[0] = 0;
      local_1a8.x.n[1] = 0;
      local_1a8.x.n[2] = 0;
      local_1a8.x.n[3] = 0;
      local_1a8.x.n[4] = 0;
      local_1a8.y.n[0] = 0;
      local_1a8.y.n[1] = 0;
      local_1a8.y.n[2] = 0;
      local_1a8.y.n[3] = 0;
      local_1a8.y.n[4] = 0;
      local_1a8.z.n[0] = 0;
      local_1a8.z.n[1] = 0;
      local_1a8.z.n[2] = 0;
      local_1a8.z.n[3] = 0;
      local_1a8.z.n[4] = 0;
      lVar8 = local_210;
      local_1e8 = pcm_in;
      do {
        iVar4 = load_ge(&local_88,*pcm_in,sVar6);
        if (iVar4 == 0) {
          return 3;
        }
        secp256k1_gej_add_ge_var(&local_1a8,&local_1a8,&local_88,(secp256k1_fe *)0x0);
        pcm_in = pcm_in + sVar7;
        lVar8 = lVar8 + -1;
        sVar6 = extraout_RDX_01;
      } while (lVar8 != 0);
      secp256k1_gej_add_ge_var(&local_1a8,&local_1a8,&local_e0,(secp256k1_fe *)0x0);
      if (local_1a8.infinity == 0) {
        secp256k1_ge_set_gej(&local_88,&local_1a8);
        secp256k1_eckey_pubkey_serialize
                  (&local_88,local_1e0 + (sVar5 + local_200) * 0x21,&local_1b0,1);
        sVar6 = extraout_RDX_03;
      }
      else {
        lVar8 = (local_200 + sVar5) * 0x21;
        puVar1 = local_1e0 + lVar8 + 0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        puVar1 = local_1e0 + lVar8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        local_1e0[lVar8 + 0x20] = '\0';
        sVar6 = extraout_RDX_02;
      }
      sVar3 = local_1f0;
      sVar5 = sVar5 + 1;
      pcm_in = local_1e8 + 1;
    } while (sVar5 != local_208);
    iVar4 = 0;
    if (blinds != (uint8_t **)0x0 && local_1f8 != (uint8_t *)0x0) {
      local_108.d[2] = 0;
      local_108.d[3] = 0;
      local_108.d[0] = 0;
      local_108.d[1] = 0;
      lVar8 = 0;
      do {
        secp256k1_scalar_set_b32(&local_128,blinds[lVar8],&local_214);
        if (local_214 != 0) {
          return 5;
        }
        secp256k1_scalar_add(&local_108,&local_108,&local_128);
        lVar2 = local_210;
        lVar8 = lVar8 + 1;
      } while (local_210 != lVar8);
      local_1d8.d[2] = 0;
      local_1d8.d[3] = 0;
      local_1d8.d[0] = 0;
      local_1d8.d[1] = 0;
      if (sVar3 != 0) {
        sVar7 = 0;
        do {
          secp256k1_scalar_set_b32(&local_128,blinds[lVar2 + sVar7],&local_214);
          if (local_214 != 0) {
            return 5;
          }
          secp256k1_scalar_add(&local_1d8,&local_1d8,&local_128);
          sVar7 = sVar7 + 1;
        } while (local_1f0 != sVar7);
      }
      secp256k1_scalar_negate(&local_1d8,&local_1d8);
      secp256k1_scalar_add(&local_128,&local_108,&local_1d8);
      secp256k1_scalar_get_b32(local_1f8,&local_128);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int secp256k1_prepare_mlsag(uint8_t *m, uint8_t *sk,
    size_t nOuts, size_t nBlinded, size_t nCols, size_t nRows,
    const uint8_t **pcm_in, const uint8_t **pcm_out, const uint8_t **blinds)
{
    /*
        Last matrix row is sum of input commitments - sum of output commitments

        Will return after summing commitments if sk or blinds is null

        m[col+(cols*row)]
        pcm_in[col+(cols*row)]
        pcm_out[nOuts]

        blinds[nBlinded]  array of pointers to 32byte blinding keys, inputs and outputs

        no. of inputs is nRows -1

        sum blinds up to nBlinded, pass fee commitment in pcm_out after nBlinded

    */

    secp256k1_gej accj;
    secp256k1_ge c, cno;
    size_t nIns = nRows -1;
    size_t s, i, k;
    int overflow;
    secp256k1_scalar accos, accis, ts;

    if (!m
        || nRows < 2
        || nCols < 1
        || nOuts < 1) {
        return 1;
    }

    /* sum output commitments */
    secp256k1_gej_set_infinity(&accj);
    for (k = 0; k < nOuts; ++k) {
        if (!load_ge(&c, pcm_out[k], 33)) {
            return 2;
        }
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
    }

    secp256k1_gej_neg(&accj, &accj);
    secp256k1_ge_set_gej(&cno, &accj);

    for (k = 0; k < nCols; ++k) {
        /* sum column input commitments */
        secp256k1_gej_set_infinity(&accj);
        for (i = 0; i < nIns; ++i) {
            if (!load_ge(&c, pcm_in[k+nCols*i], 33)) {
                return 3;
            }
            secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        }

        /* subtract output commitments */
        secp256k1_gej_add_ge_var(&accj, &accj, &cno, NULL);

        /* store in last row, nRows -1 */
        if (secp256k1_gej_is_infinity(&accj)) {
            /* With no blinds set, sum input commitments == sum output commitments */
            memset(&m[(k+nCols*nIns)*33], 0, 33); /* consistent infinity point */
            continue;
        }
        secp256k1_ge_set_gej(&c, &accj);
        secp256k1_eckey_pubkey_serialize(&c, &m[(k+nCols*nIns)*33], &s, 1);
        /* pedersen_commitment_save(&m[(k+nCols*nIns)*33], &c); */
    }

    if (!sk || !blinds) {
        return 0;
    }

    /* sum input blinds */
    secp256k1_scalar_clear(&accis);
    for (k = 0; k < nIns; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accis, &accis, &ts);
    }

    /* sum output blinds */
    secp256k1_scalar_clear(&accos);
    for (k = 0; k < nBlinded; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[nIns+k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accos, &accos, &ts);
    }

    secp256k1_scalar_negate(&accos, &accos);

    /* subtract output blinds */
    secp256k1_scalar_add(&ts, &accis, &accos);

    secp256k1_scalar_get_b32(sk, &ts);

    return 0;
}